

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::PrintOps(WasmBinaryReader *this)

{
  bool bVar1;
  WasmOp WVar2;
  uint uVar3;
  uint uVar4;
  Memory *this_00;
  WasmOp *obj;
  WasmFunctionInfo *pWVar5;
  int j;
  char16_t *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char16_t *pcVar10;
  int iVar11;
  size_t count;
  undefined1 local_60 [8];
  EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  
  uVar7 = (this->m_ops->
          super_BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ).count - (this->m_ops->
                    super_BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ).freeCount;
  if (uVar7 != 0) {
    count = (size_t)(int)uVar7;
    local_60 = (undefined1  [8])&WasmOp::typeinfo;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .entries = (EntryType *)0x0;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .dictionary = (BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)anon_var_dwarf_acfdf34;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .usedEntryCount = 0xb8;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    ._8_8_ = count;
    this_00 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
    iVar11 = 0;
    obj = Memory::AllocateArray<Memory::HeapAllocator,Wasm::WasmOp,false>
                    (this_00,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,count);
    JsUtil::
    BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_60,this->m_ops);
    while (bVar1 = JsUtil::
                   BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::
                   EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   ::IsValid((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                              *)local_60), bVar1) {
      WVar2 = JsUtil::
              BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
              ::CurrentKey((IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_60);
      obj[iVar11] = WVar2;
      JsUtil::
      BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)local_60);
      iVar11 = iVar11 + 1;
    }
    uVar8 = (ulong)uVar7;
    uVar3 = 0;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
      uVar3 = 0;
    }
    for (; uVar7 = uVar3, uVar3 != (uint)uVar8; uVar3 = uVar3 + 1) {
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        WVar2 = obj[uVar7];
        if (obj[(ulong)uVar7 - 1] <= WVar2) break;
        obj[uVar7] = obj[(ulong)uVar7 - 1];
        obj[(ulong)uVar7 - 1] = WVar2;
      }
    }
    pWVar5 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,0);
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(pWVar5->m_body).ptr);
    Output::Print(L"Module #%u\'s current opcode distribution\n",(ulong)uVar4);
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      WVar2 = obj[uVar9];
      switch(WVar2) {
      case wbV128Load:
        pcVar10 = L"V128Load";
        pcVar6 = L"v128.load";
        break;
      case wbV128Load|wbNop:
      case wbV128Load|wbBlock:
      case wbV128Load|wbLoop:
      case wbV128Load|wbIf:
      case wbV128Load|wbElse:
      case wbV128Load|wbIf|wbBlock:
      case wbV128Load|wbIf|wbLoop:
      case 0xfd08:
      case 0xfd09:
      case 0xfd0a:
      case wbV128Const|wbBlock:
      case wbV128And|wbNop:
      case wbV128Bitselect|wbNop:
      case wbV128Or|wbIf:
      case wbV128Or|wbElse:
      case wbV128Or|wbIf|wbBlock:
      case wbV128Or|wbIf|wbLoop:
      case 0xfd58:
      case 0xfd59:
      case 0xfd5a:
      case wbV128Or|wbEnd:
      case wbV128Or|wbBr:
      case wbV128Or|wbBrIf:
      case wbV128Or|wbBrTable:
      case wbV128Or|wbReturn:
      case wbI4GeU|wbGetLocal:
      case wbI4GeU|wbSetGlobal:
      case wbI4GeU|wbSetGlobal|wbNop:
      case wbI4GeU|wbSetGlobal|wbBlock:
      case wbI4GeU|wbSetGlobal|wbLoop:
      case wbI4GeU|wbI32LoadMem:
      case wbI4GeU|wbI64LoadMem:
      case wbI4GeU|wbF32LoadMem:
      case wbI16AddSaturateU|wbIf:
      case wbI16AddSaturateU|wbElse:
      case wbI16AddSaturateU|wbIf|wbBlock:
      case wbI16AddSaturateU|wbIf|wbLoop:
      case 0xfd78:
      case 0xfd79:
      case 0xfd7a:
      case wbI16AddSaturateU|wbEnd:
      case wbI16AddSaturateU|wbBr:
      case wbI16AddSaturateU|wbBrIf:
      case wbI16AddSaturateU|wbBrTable:
      case wbI16AddSaturateU|wbReturn:
      case wbV128Load|wbI64DivU:
      case wbV128Load|wbI64Or:
      case wbV128Load|wbI64Xor:
      case wbV128Load|wbI64Shl:
      case wbV128Load|wbI64ShrS:
      case wbV128Load|wbI64ShrU:
      case wbV128Load|wbI64Rol:
      case wbV128Load|wbI64Ror:
      case wbI8AddSaturateU|wbIf:
      case wbI8AddSaturateU|wbIf|wbBlock:
      case wbI8AddSaturateU|wbIf|wbLoop:
      case 0xfd98:
      case 0xfd99:
      case 0xfd9a:
      case wbI8AddSaturateU|wbEnd:
      case wbI8AddSaturateU|wbBr:
      case wbI8AddSaturateU|wbBrIf:
      case wbI8AddSaturateU|wbBrTable:
      case wbI8AddSaturateU|wbReturn:
      case wbV128Load|wbF64Add:
      case wbV128Load|wbF64Min:
      case wbV128Load|wbF64Max:
      case wbV128Load|wbF64CopySign:
      case wbV128Load|wbI32Wrap_I64:
      case wbV128Load|wbI32TruncS_F32:
      case wbV128Load|wbI32TruncU_F32:
      case wbV128Load|wbI32TruncS_F64:
      case wbI4Add|wbNop:
      case wbV128Load|wbI64TruncS_F64:
      case wbV128Load|wbF32SConvertI32:
      case wbV128Load|wbF32UConvertI32:
      case wbV128Load|wbF32SConvertI64:
      case wbV128Load|wbF32DemoteF64:
      case wbV128Load|wbF64SConvertI32:
      case wbV128Load|wbF64UConvertI32:
      case wbV128Load|wbF64SConvertI64:
      case wbV128Load|wbF64UConvertI64:
      case wbV128Load|wbF64PromoteF32:
      case wbV128Load|wbI32ReinterpretF32:
      case wbV128Load|wbI64ReinterpretF64:
      case wbV128Load|wbF32ReinterpretI32:
      case wbV128Load|wbF64ReinterpretI64:
      case wbV128Load|wbI32Extend8_s:
      case wbV128Load|wbI64Extend8_s:
      case wbV128Load|wbI64Extend16_s:
      case wbV128Load|wbI64Extend32_s:
      case wbV128Load|wbI64Extend32_s|wbNop:
      case wbV128Load|wbI64Extend32_s|wbBlock:
      case wbV128Load|wbI64Extend32_s|wbLoop:
      case 0xfdc8:
      case 0xfdc9:
      case 0xfdca:
      case wbI2Add|wbNop:
      case wbV128Load|wbI32Extend8_s|wbCall:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbLoop:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbElse:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbLoop:
      case 0xfdd8:
      case 0xfdd9:
      case wbV128Load|wbI32Extend8_s|wbDrop:
      case wbV128Load|wbI32Extend8_s|wbSelect:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBr:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrTable:
      case wbV128Load|wbI32Extend8_s|wbCall|wbReturn:
      case wbF4Abs|wbBlock:
      case wbF4Min|wbBlock:
      case wbF4Min|wbLoop:
      case wbF2Abs|wbBlock:
      case wbF2Min|wbBlock:
      case wbF2Min|wbLoop:
      case wbI4TruncS|wbIf:
      case wbI4TruncS|wbElse:
      case wbI4TruncS|wbIf|wbBlock:
      case wbI4TruncS|wbIf|wbLoop:
      case 0xfe00:
      case 0xfe01:
      case 0xfe02:
      case 0xfe03:
      case 0xfe04:
      case 0xfe05:
      case 0xfe06:
      case 0xfe07:
      case 0xfe08:
      case 0xfe09:
      case 0xfe0a:
      case 0xfe0b:
      case 0xfe0c:
      case 0xfe0d:
      case 0xfe0e:
      case 0xfe0f:
        goto switchD_00d6487b_caseD_fd01;
      case wbV128Store:
        pcVar10 = L"V128Store";
        pcVar6 = L"v128.store";
        break;
      case wbV128Const:
        pcVar10 = L"V128Const";
        pcVar6 = L"v128.const";
        break;
      case wbV8X16Shuffle:
        pcVar10 = L"V8X16Shuffle";
        pcVar6 = L"i8x16.shuffle";
        break;
      case wbI16Splat:
        pcVar10 = L"I16Splat";
        pcVar6 = L"i8x16.splat";
        break;
      case wbI8Splat:
        pcVar10 = L"I8Splat";
        pcVar6 = L"i16x8.splat";
        break;
      case wbI4Splat:
        pcVar10 = L"I4Splat";
        pcVar6 = L"i32x4.splat";
        break;
      case wbI2Splat:
        pcVar10 = L"I2Splat";
        pcVar6 = L"i64x2.splat";
        break;
      case wbF4Splat:
        pcVar10 = L"F4Splat";
        pcVar6 = L"f32x4.splat";
        break;
      case wbF2Splat:
        pcVar10 = L"F2Splat";
        pcVar6 = L"f64x2.splat";
        break;
      case wbI16ExtractLaneS:
        pcVar10 = L"I16ExtractLaneS";
        pcVar6 = L"i8x16.extract_lane_s";
        break;
      case wbI16ExtractLaneU:
        pcVar10 = L"I16ExtractLaneU";
        pcVar6 = L"i8x16.extract_lane_u";
        break;
      case wbI16ReplaceLane:
        pcVar10 = L"I16ReplaceLane";
        pcVar6 = L"i8x16.replace_lane";
        break;
      case wbI8ExtractLaneS:
        pcVar10 = L"I8ExtractLaneS";
        pcVar6 = L"i16x8.extract_lane_s";
        break;
      case wbI8ExtractLaneU:
        pcVar10 = L"I8ExtractLaneU";
        pcVar6 = L"i16x8.extract_lane_u";
        break;
      case wbI8ReplaceLane:
        pcVar10 = L"I8ReplaceLane";
        pcVar6 = L"i16x8.replace_lane";
        break;
      case wbI4ExtractLane:
        pcVar10 = L"I4ExtractLane";
        pcVar6 = L"i32x4.extract_lane";
        break;
      case wbI4ReplaceLane:
        pcVar10 = L"I4ReplaceLane";
        pcVar6 = L"i32x4.replace_lane";
        break;
      case wbI2ExtractLane:
        pcVar10 = L"I2ExtractLane";
        pcVar6 = L"i64x2.extract_lane";
        break;
      case wbI2ReplaceLane:
        pcVar10 = L"I2ReplaceLane";
        pcVar6 = L"i64x2.replace_lane";
        break;
      case wbF4ExtractLane:
        pcVar10 = L"F4ExtractLane";
        pcVar6 = L"f32x4.extract_lane";
        break;
      case wbF4ReplaceLane:
        pcVar10 = L"F4ReplaceLane";
        pcVar6 = L"f32x4.replace_lane";
        break;
      case wbF2ExtractLane:
        pcVar10 = L"F2ExtractLane";
        pcVar6 = L"f64x2.extract_lane";
        break;
      case wbF2ReplaceLane:
        pcVar10 = L"F2ReplaceLane";
        pcVar6 = L"f64x2.replace_lane";
        break;
      case wbI16Eq:
        pcVar10 = L"I16Eq";
        pcVar6 = L"i8x16.eq";
        break;
      case wbI16Ne:
        pcVar10 = L"I16Ne";
        pcVar6 = L"i8x16.ne";
        break;
      case wbI16LtS:
        pcVar10 = L"I16LtS";
        pcVar6 = L"i8x16.lt_s";
        break;
      case wbI16LtU:
        pcVar10 = L"I16LtU";
        pcVar6 = L"i8x16.lt_u";
        break;
      case wbI16GtS:
        pcVar10 = L"I16GtS";
        pcVar6 = L"i8x16.gt_s";
        break;
      case wbI16GtU:
        pcVar10 = L"I16GtU";
        pcVar6 = L"i8x16.gt_u";
        break;
      case wbI16LeS:
        pcVar10 = L"I16LeS";
        pcVar6 = L"i8x16.le_s";
        break;
      case wbI16LeU:
        pcVar10 = L"I16LeU";
        pcVar6 = L"i8x16.le_u";
        break;
      case wbI16GeS:
        pcVar10 = L"I16GeS";
        pcVar6 = L"i8x16.ge_s";
        break;
      case wbI16GeU:
        pcVar10 = L"I16GeU";
        pcVar6 = L"i8x16.ge_u";
        break;
      case wbI8Eq:
        pcVar10 = L"I8Eq";
        pcVar6 = L"i16x8.eq";
        break;
      case wbI8Ne:
        pcVar10 = L"I8Ne";
        pcVar6 = L"i16x8.ne";
        break;
      case wbI8LtS:
        pcVar10 = L"I8LtS";
        pcVar6 = L"i16x8.lt_s";
        break;
      case wbI8LtU:
        pcVar10 = L"I8LtU";
        pcVar6 = L"i16x8.lt_u";
        break;
      case wbI8GtS:
        pcVar10 = L"I8GtS";
        pcVar6 = L"i16x8.gt_s";
        break;
      case wbI8GtU:
        pcVar10 = L"I8GtU";
        pcVar6 = L"i16x8.gt_u";
        break;
      case wbI8LeS:
        pcVar10 = L"I8LeS";
        pcVar6 = L"i16x8.le_s";
        break;
      case wbI8LeU:
        pcVar10 = L"I8LeU";
        pcVar6 = L"i16x8.le_u";
        break;
      case wbI8GeS:
        pcVar10 = L"I8GeS";
        pcVar6 = L"i16x8.ge_s";
        break;
      case wbI8GeU:
        pcVar10 = L"I8GeU";
        pcVar6 = L"i16x8.ge_u";
        break;
      case wbI4Eq:
        pcVar10 = L"I4Eq";
        pcVar6 = L"i32x4.eq";
        break;
      case wbI4Ne:
        pcVar10 = L"I4Ne";
        pcVar6 = L"i32x4.ne";
        break;
      case wbI4LtS:
        pcVar10 = L"I4LtS";
        pcVar6 = L"i32x4.lt_s";
        break;
      case wbI4LtU:
        pcVar10 = L"I4LtU";
        pcVar6 = L"i32x4.lt_u";
        break;
      case wbI4GtS:
        pcVar10 = L"I4GtS";
        pcVar6 = L"i32x4.gt_s";
        break;
      case wbI4GtU:
        pcVar10 = L"I4GtU";
        pcVar6 = L"i32x4.gt_u";
        break;
      case wbI4LeS:
        pcVar10 = L"I4LeS";
        pcVar6 = L"i32x4.le_s";
        break;
      case wbI4LeU:
        pcVar10 = L"I4LeU";
        pcVar6 = L"i32x4.le_u";
        break;
      case wbI4GeS:
        pcVar10 = L"I4GeS";
        pcVar6 = L"i32x4.ge_s";
        break;
      case wbI4GeU:
        pcVar10 = L"I4GeU";
        pcVar6 = L"i32x4.ge_u";
        break;
      case wbF4Eq:
        pcVar10 = L"F4Eq";
        pcVar6 = L"f32x4.eq";
        break;
      case wbF4Ne:
        pcVar10 = L"F4Ne";
        pcVar6 = L"f32x4.ne";
        break;
      case wbF4Lt:
        pcVar10 = L"F4Lt";
        pcVar6 = L"f32x4.lt";
        break;
      case wbF4Gt:
        pcVar10 = L"F4Gt";
        pcVar6 = L"f32x4.gt";
        break;
      case wbF4Le:
        pcVar10 = L"F4Le";
        pcVar6 = L"f32x4.le";
        break;
      case wbF4Ge:
        pcVar10 = L"F4Ge";
        pcVar6 = L"f32x4.ge";
        break;
      case wbF2Eq:
        pcVar10 = L"F2Eq";
        pcVar6 = L"f64x2.eq";
        break;
      case wbF2Ne:
        pcVar10 = L"F2Ne";
        pcVar6 = L"f64x2.ne";
        break;
      case wbF2Lt:
        pcVar10 = L"F2Lt";
        pcVar6 = L"f64x2.lt";
        break;
      case wbF2Gt:
        pcVar10 = L"F2Gt";
        pcVar6 = L"f64x2.gt";
        break;
      case wbF2Le:
        pcVar10 = L"F2Le";
        pcVar6 = L"f64x2.le";
        break;
      case wbF2Ge:
        pcVar10 = L"F2Ge";
        pcVar6 = L"f64x2.ge";
        break;
      case wbV128Not:
        pcVar10 = L"V128Not";
        pcVar6 = L"v128.not";
        break;
      case wbV128And:
        pcVar10 = L"V128And";
        pcVar6 = L"v128.and";
        break;
      case wbV128Or:
        pcVar10 = L"V128Or";
        pcVar6 = L"v128.or";
        break;
      case wbV128Xor:
        pcVar10 = L"V128Xor";
        pcVar6 = L"v128.xor";
        break;
      case wbV128Bitselect:
        pcVar10 = L"V128Bitselect";
        pcVar6 = L"v128.bitselect";
        break;
      case wbI16Neg:
        pcVar10 = L"I16Neg";
        pcVar6 = L"i8x16.neg";
        break;
      case wbI16AnyTrue:
        pcVar10 = L"I16AnyTrue";
        pcVar6 = L"i8x16.any_true";
        break;
      case wbI16AllTrue:
        pcVar10 = L"I16AllTrue";
        pcVar6 = L"i8x16.all_true";
        break;
      case wbI16Shl:
        pcVar10 = L"I16Shl";
        pcVar6 = L"i8x16.shl";
        break;
      case wbI16ShrS:
        pcVar10 = L"I16ShrS";
        pcVar6 = L"i8x16.shr_s";
        break;
      case wbI16ShrU:
        pcVar10 = L"I16ShrU";
        pcVar6 = L"i8x16.shr_u";
        break;
      case wbI16Add:
        pcVar10 = L"I16Add";
        pcVar6 = L"i8x16.add";
        break;
      case wbI16AddSaturateS:
        pcVar10 = L"I16AddSaturateS";
        pcVar6 = L"i8x16.add_sat_s";
        break;
      case wbI16AddSaturateU:
        pcVar10 = L"I16AddSaturateU";
        pcVar6 = L"i8x16.add_sat_u";
        break;
      case wbI16Sub:
        pcVar10 = L"I16Sub";
        pcVar6 = L"i8x16.sub";
        break;
      case wbI16SubSaturateS:
        pcVar10 = L"I16SubSaturateS";
        pcVar6 = L"i8x16.sub_sat_s";
        break;
      case wbI16SubSaturateU:
        pcVar10 = L"I16SubSaturateU";
        pcVar6 = L"i8x16.sub_sat_u";
        break;
      case wbI8Neg:
        pcVar10 = L"I8Neg";
        pcVar6 = L"i16x8.neg";
        break;
      case wbI8AnyTrue:
        pcVar10 = L"I8AnyTrue";
        pcVar6 = L"i16x8.any_true";
        break;
      case wbI8AllTrue:
        pcVar10 = L"I8AllTrue";
        pcVar6 = L"i16x8.all_true";
        break;
      case wbI8Shl:
        pcVar10 = L"I8Shl";
        pcVar6 = L"i16x8.shl";
        break;
      case wbI8ShrS:
        pcVar10 = L"I8ShrS";
        pcVar6 = L"i16x8.shr_s";
        break;
      case wbI8ShrU:
        pcVar10 = L"I8ShrU";
        pcVar6 = L"i16x8.shr_u";
        break;
      case wbI8Add:
        pcVar10 = L"I8Add";
        pcVar6 = L"i16x8.add";
        break;
      case wbI8AddSaturateS:
        pcVar10 = L"I8AddSaturateS";
        pcVar6 = L"i16x8.add_sat_s";
        break;
      case wbI8AddSaturateU:
        pcVar10 = L"I8AddSaturateU";
        pcVar6 = L"i16x8.add_sat_u";
        break;
      case wbI8Sub:
        pcVar10 = L"I8Sub";
        pcVar6 = L"i16x8.sub";
        break;
      case wbI8SubSaturateS:
        pcVar10 = L"I8SubSaturateS";
        pcVar6 = L"i16x8.sub_sat_s";
        break;
      case wbI8SubSaturateU:
        pcVar10 = L"I8SubSaturateU";
        pcVar6 = L"i16x8.sub_sat_u";
        break;
      case wbI8Mul:
        pcVar10 = L"I8Mul";
        pcVar6 = L"i16x8.mul";
        break;
      case wbI4Neg:
        pcVar10 = L"I4Neg";
        pcVar6 = L"i32x4.neg";
        break;
      case wbI4AnyTrue:
        pcVar10 = L"I4AnyTrue";
        pcVar6 = L"i32x4.any_true";
        break;
      case wbI4AllTrue:
        pcVar10 = L"I4AllTrue";
        pcVar6 = L"i32x4.all_true";
        break;
      case wbI4Shl:
        pcVar10 = L"I4Shl";
        pcVar6 = L"i32x4.shl";
        break;
      case wbI4ShrS:
        pcVar10 = L"I4ShrS";
        pcVar6 = L"i32x4.shr_s";
        break;
      case wbI4ShrU:
        pcVar10 = L"I4ShrU";
        pcVar6 = L"i32x4.shr_u";
        break;
      case wbI4Add:
        pcVar10 = L"I4Add";
        pcVar6 = L"i32x4.add";
        break;
      case wbI4Sub:
        pcVar10 = L"I4Sub";
        pcVar6 = L"i32x4.sub";
        break;
      case wbI4Mul:
        pcVar10 = L"I4Mul";
        pcVar6 = L"i32x4.mul";
        break;
      case wbI2Neg:
        pcVar10 = L"I2Neg";
        pcVar6 = L"i64x2.neg";
        break;
      case wbI2Shl:
        pcVar10 = L"I2Shl";
        pcVar6 = L"i64x2.shl";
        break;
      case wbI2ShrS:
        pcVar10 = L"I2ShrS";
        pcVar6 = L"i64x2.shr_s";
        break;
      case wbI2ShrU:
        pcVar10 = L"I2ShrU";
        pcVar6 = L"i64x2.shr_u";
        break;
      case wbI2Add:
        pcVar10 = L"I2Add";
        pcVar6 = L"i64x2.add";
        break;
      case wbI2Sub:
        pcVar10 = L"I2Sub";
        pcVar6 = L"i64x2.sub";
        break;
      case wbF4Abs:
        pcVar10 = L"F4Abs";
        pcVar6 = L"f32x4.abs";
        break;
      case wbF4Neg:
        pcVar10 = L"F4Neg";
        pcVar6 = L"f32x4.neg";
        break;
      case wbF4Sqrt:
        pcVar10 = L"F4Sqrt";
        pcVar6 = L"f32x4.sqrt";
        break;
      case wbF4Add:
        pcVar10 = L"F4Add";
        pcVar6 = L"f32x4.add";
        break;
      case wbF4Sub:
        pcVar10 = L"F4Sub";
        pcVar6 = L"f32x4.sub";
        break;
      case wbF4Mul:
        pcVar10 = L"F4Mul";
        pcVar6 = L"f32x4.mul";
        break;
      case wbF4Div:
        pcVar10 = L"F4Div";
        pcVar6 = L"f32x4.div";
        break;
      case wbF4Min:
        pcVar10 = L"F4Min";
        pcVar6 = L"f32x4.min";
        break;
      case wbF4Max:
        pcVar10 = L"F4Max";
        pcVar6 = L"f32x4.max";
        break;
      case wbF2Abs:
        pcVar10 = L"F2Abs";
        pcVar6 = L"f64x2.abs";
        break;
      case wbF2Neg:
        pcVar10 = L"F2Neg";
        pcVar6 = L"f64x2.neg";
        break;
      case wbF2Sqrt:
        pcVar10 = L"F2Sqrt";
        pcVar6 = L"f64x2.sqrt";
        break;
      case wbF2Add:
        pcVar10 = L"F2Add";
        pcVar6 = L"f64x2.add";
        break;
      case wbF2Sub:
        pcVar10 = L"F2Sub";
        pcVar6 = L"f64x2.sub";
        break;
      case wbF2Mul:
        pcVar10 = L"F2Mul";
        pcVar6 = L"f64x2.mul";
        break;
      case wbF2Div:
        pcVar10 = L"F2Div";
        pcVar6 = L"f64x2.div";
        break;
      case wbF2Min:
        pcVar10 = L"F2Min";
        pcVar6 = L"f64x2.min";
        break;
      case wbF2Max:
        pcVar10 = L"F2Max";
        pcVar6 = L"f64x2.max";
        break;
      case wbI4TruncS:
        pcVar10 = L"I4TruncS";
        pcVar6 = L"i32x4.trunc_sat_f32x4_s";
        break;
      case wbI4TruncU:
        pcVar10 = L"I4TruncU";
        pcVar6 = L"i32x4.trunc_sat_f32x4_u";
        break;
      case wbF4ConvertS:
        pcVar10 = L"F4ConvertS";
        pcVar6 = L"f32x4.convert_i32x4_s";
        break;
      case wbF4ConvertU:
        pcVar10 = L"F4ConvertU";
        pcVar6 = L"f32x4.convert_i32x4_u";
        break;
      case wbI32AtomicLoad:
        pcVar10 = L"I32AtomicLoad";
        pcVar6 = L"i32.atomic.load";
        break;
      case wbI64AtomicLoad:
        pcVar10 = L"I64AtomicLoad";
        pcVar6 = L"i64.atomic.load";
        break;
      case wbI32AtomicLoad8U:
        pcVar10 = L"I32AtomicLoad8U";
        pcVar6 = L"i32.atomic.load8_u";
        break;
      case wbI32AtomicLoad16U:
        pcVar10 = L"I32AtomicLoad16U";
        pcVar6 = L"i32.atomic.load16_u";
        break;
      case wbI64AtomicLoad8U:
        pcVar10 = L"I64AtomicLoad8U";
        pcVar6 = L"i64.atomic.load8_u";
        break;
      case wbI64AtomicLoad16U:
        pcVar10 = L"I64AtomicLoad16U";
        pcVar6 = L"i64.atomic.load16_u";
        break;
      case wbI64AtomicLoad32U:
        pcVar10 = L"I64AtomicLoad32U";
        pcVar6 = L"i64.atomic.load32_u";
        break;
      case wbI32AtomicStore:
        pcVar10 = L"I32AtomicStore";
        pcVar6 = L"i32.atomic.store";
        break;
      case wbI64AtomicStore:
        pcVar10 = L"I64AtomicStore";
        pcVar6 = L"i64.atomic.store";
        break;
      case wbI32AtomicStore8:
        pcVar10 = L"I32AtomicStore8";
        pcVar6 = L"i32.atomic.store8";
        break;
      case wbI32AtomicStore16:
        pcVar10 = L"I32AtomicStore16";
        pcVar6 = L"i32.atomic.store16";
        break;
      case wbI64AtomicStore8:
        pcVar10 = L"I64AtomicStore8";
        pcVar6 = L"i64.atomic.store8";
        break;
      case wbI64AtomicStore16:
        pcVar10 = L"I64AtomicStore16";
        pcVar6 = L"i64.atomic.store16";
        break;
      case wbI64AtomicStore32:
        pcVar10 = L"I64AtomicStore32";
        pcVar6 = L"i64.atomic.store32";
        break;
      case wbI32AtomicRmwAdd:
        pcVar10 = L"I32AtomicRmwAdd";
        pcVar6 = L"i32.atomic.rmw.add";
        break;
      case wbI64AtomicRmwAdd:
        pcVar10 = L"I64AtomicRmwAdd";
        pcVar6 = L"i64.atomic.rmw.add";
        break;
      case wbI32AtomicRmw8UAdd:
        pcVar10 = L"I32AtomicRmw8UAdd";
        pcVar6 = L"i32.atomic.rmw8_u.add";
        break;
      case wbI32AtomicRmw16UAdd:
        pcVar10 = L"I32AtomicRmw16UAdd";
        pcVar6 = L"i32.atomic.rmw16_u.add";
        break;
      case wbI64AtomicRmw8UAdd:
        pcVar10 = L"I64AtomicRmw8UAdd";
        pcVar6 = L"i64.atomic.rmw8_u.add";
        break;
      case wbI64AtomicRmw16UAdd:
        pcVar10 = L"I64AtomicRmw16UAdd";
        pcVar6 = L"i64.atomic.rmw16_u.add";
        break;
      case wbI64AtomicRmw32UAdd:
        pcVar10 = L"I64AtomicRmw32UAdd";
        pcVar6 = L"i64.atomic.rmw32_u.add";
        break;
      case wbI32AtomicRmwSub:
        pcVar10 = L"I32AtomicRmwSub";
        pcVar6 = L"i32.atomic.rmw.sub";
        break;
      case wbI64AtomicRmwSub:
        pcVar10 = L"I64AtomicRmwSub";
        pcVar6 = L"i64.atomic.rmw.sub";
        break;
      case wbI32AtomicRmw8USub:
        pcVar10 = L"I32AtomicRmw8USub";
        pcVar6 = L"i32.atomic.rmw8_u.sub";
        break;
      case wbI32AtomicRmw16USub:
        pcVar10 = L"I32AtomicRmw16USub";
        pcVar6 = L"i32.atomic.rmw16_u.sub";
        break;
      case wbI64AtomicRmw8USub:
        pcVar10 = L"I64AtomicRmw8USub";
        pcVar6 = L"i64.atomic.rmw8_u.sub";
        break;
      case wbI64AtomicRmw16USub:
        pcVar10 = L"I64AtomicRmw16USub";
        pcVar6 = L"i64.atomic.rmw16_u.sub";
        break;
      case wbI64AtomicRmw32USub:
        pcVar10 = L"I64AtomicRmw32USub";
        pcVar6 = L"i64.atomic.rmw32_u.sub";
        break;
      case wbI32AtomicRmwAnd:
        pcVar10 = L"I32AtomicRmwAnd";
        pcVar6 = L"i32.atomic.rmw.and";
        break;
      case wbI64AtomicRmwAnd:
        pcVar10 = L"I64AtomicRmwAnd";
        pcVar6 = L"i64.atomic.rmw.and";
        break;
      case wbI32AtomicRmw8UAnd:
        pcVar10 = L"I32AtomicRmw8UAnd";
        pcVar6 = L"i32.atomic.rmw8_u.and";
        break;
      case wbI32AtomicRmw16UAnd:
        pcVar10 = L"I32AtomicRmw16UAnd";
        pcVar6 = L"i32.atomic.rmw16_u.and";
        break;
      case wbI64AtomicRmw8UAnd:
        pcVar10 = L"I64AtomicRmw8UAnd";
        pcVar6 = L"i64.atomic.rmw8_u.and";
        break;
      case wbI64AtomicRmw16UAnd:
        pcVar10 = L"I64AtomicRmw16UAnd";
        pcVar6 = L"i64.atomic.rmw16_u.and";
        break;
      case wbI64AtomicRmw32UAnd:
        pcVar10 = L"I64AtomicRmw32UAnd";
        pcVar6 = L"i64.atomic.rmw32_u.and";
        break;
      case wbI32AtomicRmwOr:
        pcVar10 = L"I32AtomicRmwOr";
        pcVar6 = L"i32.atomic.rmw.or";
        break;
      case wbI64AtomicRmwOr:
        pcVar10 = L"I64AtomicRmwOr";
        pcVar6 = L"i64.atomic.rmw.or";
        break;
      case wbI32AtomicRmw8UOr:
        pcVar10 = L"I32AtomicRmw8UOr";
        pcVar6 = L"i32.atomic.rmw8_u.or";
        break;
      case wbI32AtomicRmw16UOr:
        pcVar10 = L"I32AtomicRmw16UOr";
        pcVar6 = L"i32.atomic.rmw16_u.or";
        break;
      case wbI64AtomicRmw8UOr:
        pcVar10 = L"I64AtomicRmw8UOr";
        pcVar6 = L"i64.atomic.rmw8_u.or";
        break;
      case wbI64AtomicRmw16UOr:
        pcVar10 = L"I64AtomicRmw16UOr";
        pcVar6 = L"i64.atomic.rmw16_u.or";
        break;
      case wbI64AtomicRmw32UOr:
        pcVar10 = L"I64AtomicRmw32UOr";
        pcVar6 = L"i64.atomic.rmw32_u.or";
        break;
      case wbI32AtomicRmwXor:
        pcVar10 = L"I32AtomicRmwXor";
        pcVar6 = L"i32.atomic.rmw.xor";
        break;
      case wbI64AtomicRmwXor:
        pcVar10 = L"I64AtomicRmwXor";
        pcVar6 = L"i64.atomic.rmw.xor";
        break;
      case wbI32AtomicRmw8UXor:
        pcVar10 = L"I32AtomicRmw8UXor";
        pcVar6 = L"i32.atomic.rmw8_u.xor";
        break;
      case wbI32AtomicRmw16UXor:
        pcVar10 = L"I32AtomicRmw16UXor";
        pcVar6 = L"i32.atomic.rmw16_u.xor";
        break;
      case wbI64AtomicRmw8UXor:
        pcVar10 = L"I64AtomicRmw8UXor";
        pcVar6 = L"i64.atomic.rmw8_u.xor";
        break;
      case wbI64AtomicRmw16UXor:
        pcVar10 = L"I64AtomicRmw16UXor";
        pcVar6 = L"i64.atomic.rmw16_u.xor";
        break;
      case wbI64AtomicRmw32UXor:
        pcVar10 = L"I64AtomicRmw32UXor";
        pcVar6 = L"i64.atomic.rmw32_u.xor";
        break;
      case wbI32AtomicRmwXchg:
        pcVar10 = L"I32AtomicRmwXchg";
        pcVar6 = L"i32.atomic.rmw.xchg";
        break;
      case wbI64AtomicRmwXchg:
        pcVar10 = L"I64AtomicRmwXchg";
        pcVar6 = L"i64.atomic.rmw.xchg";
        break;
      case wbI32AtomicRmw8UXchg:
        pcVar10 = L"I32AtomicRmw8UXchg";
        pcVar6 = L"i32.atomic.rmw8_u.xchg";
        break;
      case wbI32AtomicRmw16UXchg:
        pcVar10 = L"I32AtomicRmw16UXchg";
        pcVar6 = L"i32.atomic.rmw16_u.xchg";
        break;
      case wbI64AtomicRmw8UXchg:
        pcVar10 = L"I64AtomicRmw8UXchg";
        pcVar6 = L"i64.atomic.rmw8_u.xchg";
        break;
      case wbI64AtomicRmw16UXchg:
        pcVar10 = L"I64AtomicRmw16UXchg";
        pcVar6 = L"i64.atomic.rmw16_u.xchg";
        break;
      case wbI64AtomicRmw32UXchg:
        pcVar10 = L"I64AtomicRmw32UXchg";
        pcVar6 = L"i64.atomic.rmw32_u.xchg";
        break;
      case wbI32AtomicRmwCmpxchg:
        pcVar10 = L"I32AtomicRmwCmpxchg";
        pcVar6 = L"i32.atomic.rmw.cmpxchg";
        break;
      case wbI64AtomicRmwCmpxchg:
        pcVar10 = L"I64AtomicRmwCmpxchg";
        pcVar6 = L"i64.atomic.rmw.cmpxchg";
        break;
      case wbI32AtomicRmw8UCmpxchg:
        pcVar10 = L"I32AtomicRmw8UCmpxchg";
        pcVar6 = L"i32.atomic.rmw8_u.cmpxchg";
        break;
      case wbI32AtomicRmw16UCmpxchg:
        pcVar10 = L"I32AtomicRmw16UCmpxchg";
        pcVar6 = L"i32.atomic.rmw16_u.cmpxchg";
        break;
      case wbI64AtomicRmw8UCmpxchg:
        pcVar10 = L"I64AtomicRmw8UCmpxchg";
        pcVar6 = L"i64.atomic.rmw8_u.cmpxchg";
        break;
      case wbI64AtomicRmw16UCmpxchg:
        pcVar10 = L"I64AtomicRmw16UCmpxchg";
        pcVar6 = L"i64.atomic.rmw16_u.cmpxchg";
        break;
      case wbI64AtomicRmw32UCmpxchg:
        pcVar10 = L"I64AtomicRmw32UCmpxchg";
        pcVar6 = L"i64.atomic.rmw32_u.cmpxchg";
        break;
      default:
        switch(WVar2) {
        case wbUnreachable:
          pcVar10 = L"Unreachable";
          pcVar6 = L"unreachable";
          break;
        case wbNop:
          pcVar10 = L"Nop";
          pcVar6 = L"nop";
          break;
        case wbBlock:
          pcVar10 = L"Block";
          pcVar6 = L"block";
          break;
        case wbLoop:
          pcVar10 = L"Loop";
          pcVar6 = L"loop";
          break;
        case wbIf:
          pcVar10 = L"If";
          pcVar6 = L"if";
          break;
        case wbElse:
          pcVar10 = L"Else";
          pcVar6 = L"else";
          break;
        case wbIf|wbBlock:
        case wbIf|wbLoop:
        case 8:
        case 9:
        case 10:
        case wbCall|wbBlock:
        case wbCall|wbLoop:
        case wbCall|wbIf:
        case wbCall|wbElse:
        case wbCall|wbIf|wbBlock:
        case wbCall|wbIf|wbLoop:
        case 0x18:
        case 0x19:
        case wbCall|wbBr:
        case wbCall|wbBrIf:
        case wbCall|wbBrTable:
        case wbCall|wbReturn:
        case wbSetGlobal|wbNop:
        case wbSetGlobal|wbBlock:
        case wbSetGlobal|wbLoop:
          goto switchD_00d6487b_caseD_fd01;
        case wbEnd:
          pcVar10 = L"End";
          pcVar6 = L"end";
          break;
        case wbBr:
          pcVar10 = L"Br";
          pcVar6 = L"br";
          break;
        case wbBrIf:
          pcVar10 = L"BrIf";
          pcVar6 = L"br_if";
          break;
        case wbBrTable:
          pcVar10 = L"BrTable";
          pcVar6 = L"br_table";
          break;
        case wbReturn:
          pcVar10 = L"Return";
          pcVar6 = L"return";
          break;
        case wbCall:
          pcVar10 = L"Call";
          pcVar6 = L"call";
          break;
        case wbCallIndirect:
          pcVar10 = L"CallIndirect";
          pcVar6 = L"call_indirect";
          break;
        case wbDrop:
          pcVar10 = L"Drop";
          pcVar6 = L"drop";
          break;
        case wbSelect:
          pcVar10 = L"Select";
          pcVar6 = L"select";
          break;
        case wbGetLocal:
          pcVar10 = L"GetLocal";
          pcVar6 = L"get_local";
          break;
        case wbSetLocal:
          pcVar10 = L"SetLocal";
          pcVar6 = L"set_local";
          break;
        case wbTeeLocal:
          pcVar10 = L"TeeLocal";
          pcVar6 = L"tee_local";
          break;
        case wbGetGlobal:
          pcVar10 = L"GetGlobal";
          pcVar6 = L"get_global";
          break;
        case wbSetGlobal:
          pcVar10 = L"SetGlobal";
          pcVar6 = L"set_global";
          break;
        case wbI32LoadMem:
          pcVar10 = L"I32LoadMem";
          pcVar6 = L"i32.load";
          break;
        case wbI64LoadMem:
          pcVar10 = L"I64LoadMem";
          pcVar6 = L"i64.load";
          break;
        case wbF32LoadMem:
          pcVar10 = L"F32LoadMem";
          pcVar6 = L"f32.load";
          break;
        case wbF64LoadMem:
          pcVar10 = L"F64LoadMem";
          pcVar6 = L"f64.load";
          break;
        case wbI32LoadMem8S:
          pcVar10 = L"I32LoadMem8S";
          pcVar6 = L"i32.load8_s";
          break;
        case wbI32LoadMem8U:
          pcVar10 = L"I32LoadMem8U";
          pcVar6 = L"i32.load8_u";
          break;
        case wbI32LoadMem16S:
          pcVar10 = L"I32LoadMem16S";
          pcVar6 = L"i32.load16_s";
          break;
        case wbI32LoadMem16U:
          pcVar10 = L"I32LoadMem16U";
          pcVar6 = L"i32.load16_u";
          break;
        case wbI64LoadMem8S:
          pcVar10 = L"I64LoadMem8S";
          pcVar6 = L"i64.load8_s";
          break;
        case wbI64LoadMem8U:
          pcVar10 = L"I64LoadMem8U";
          pcVar6 = L"i64.load8_u";
          break;
        case wbI64LoadMem16S:
          pcVar10 = L"I64LoadMem16S";
          pcVar6 = L"i64.load16_s";
          break;
        case wbI64LoadMem16U:
          pcVar10 = L"I64LoadMem16U";
          pcVar6 = L"i64.load16_u";
          break;
        case wbI64LoadMem32S:
          pcVar10 = L"I64LoadMem32S";
          pcVar6 = L"i64.load32_s";
          break;
        case wbI64LoadMem32U:
          pcVar10 = L"I64LoadMem32U";
          pcVar6 = L"i64.load32_u";
          break;
        case wbI32StoreMem:
          pcVar10 = L"I32StoreMem";
          pcVar6 = L"i32.store";
          break;
        case wbI64StoreMem:
          pcVar10 = L"I64StoreMem";
          pcVar6 = L"i64.store";
          break;
        case wbF32StoreMem:
          pcVar10 = L"F32StoreMem";
          pcVar6 = L"f32.store";
          break;
        case wbF64StoreMem:
          pcVar10 = L"F64StoreMem";
          pcVar6 = L"f64.store";
          break;
        case wbI32StoreMem8:
          pcVar10 = L"I32StoreMem8";
          pcVar6 = L"i32.store8";
          break;
        case wbI32StoreMem16:
          pcVar10 = L"I32StoreMem16";
          pcVar6 = L"i32.store16";
          break;
        case wbI64StoreMem8:
          pcVar10 = L"I64StoreMem8";
          pcVar6 = L"i64.store8";
          break;
        case wbI64StoreMem16:
          pcVar10 = L"I64StoreMem16";
          pcVar6 = L"i64.store16";
          break;
        case wbI64StoreMem32:
          pcVar10 = L"I64StoreMem32";
          pcVar6 = L"i64.store32";
          break;
        case wbMemorySize:
          pcVar10 = L"MemorySize";
          pcVar6 = L"memory.size";
          break;
        case wbMemoryGrow:
          pcVar10 = L"MemoryGrow";
          pcVar6 = L"memory.grow";
          break;
        case wbI32Const:
          pcVar10 = L"I32Const";
          pcVar6 = L"i32.const";
          break;
        case wbI64Const:
          pcVar10 = L"I64Const";
          pcVar6 = L"i64.const";
          break;
        case wbF32Const:
          pcVar10 = L"F32Const";
          pcVar6 = L"f32.const";
          break;
        case wbF64Const:
          pcVar10 = L"F64Const";
          pcVar6 = L"f64.const";
          break;
        case wbI32Eqz:
          pcVar10 = L"I32Eqz";
          pcVar6 = L"i32.eqz";
          break;
        case wbI32Eq:
          pcVar10 = L"I32Eq";
          pcVar6 = L"i32.eq";
          break;
        case wbI32Ne:
          pcVar10 = L"I32Ne";
          pcVar6 = L"i32.ne";
          break;
        case wbI32LtS:
          pcVar10 = L"I32LtS";
          pcVar6 = L"i32.lt_s";
          break;
        case wbI32LtU:
          pcVar10 = L"I32LtU";
          pcVar6 = L"i32.lt_u";
          break;
        case wbI32GtS:
          pcVar10 = L"I32GtS";
          pcVar6 = L"i32.gt_s";
          break;
        case wbI32GtU:
          pcVar10 = L"I32GtU";
          pcVar6 = L"i32.gt_u";
          break;
        case wbI32LeS:
          pcVar10 = L"I32LeS";
          pcVar6 = L"i32.le_s";
          break;
        case wbI32LeU:
          pcVar10 = L"I32LeU";
          pcVar6 = L"i32.le_u";
          break;
        case wbI32GeS:
          pcVar10 = L"I32GeS";
          pcVar6 = L"i32.ge_s";
          break;
        case wbI32GeU:
          pcVar10 = L"I32GeU";
          pcVar6 = L"i32.ge_u";
          break;
        case wbI64Eqz:
          pcVar10 = L"I64Eqz";
          pcVar6 = L"i64.eqz";
          break;
        case wbI64Eq:
          pcVar10 = L"I64Eq";
          pcVar6 = L"i64.eq";
          break;
        case wbI64Ne:
          pcVar10 = L"I64Ne";
          pcVar6 = L"i64.ne";
          break;
        case wbI64LtS:
          pcVar10 = L"I64LtS";
          pcVar6 = L"i64.lt_s";
          break;
        case wbI64LtU:
          pcVar10 = L"I64LtU";
          pcVar6 = L"i64.lt_u";
          break;
        case wbI64GtS:
          pcVar10 = L"I64GtS";
          pcVar6 = L"i64.gt_s";
          break;
        case wbI64GtU:
          pcVar10 = L"I64GtU";
          pcVar6 = L"i64.gt_u";
          break;
        case wbI64LeS:
          pcVar10 = L"I64LeS";
          pcVar6 = L"i64.le_s";
          break;
        case wbI64LeU:
          pcVar10 = L"I64LeU";
          pcVar6 = L"i64.le_u";
          break;
        case wbI64GeS:
          pcVar10 = L"I64GeS";
          pcVar6 = L"i64.ge_s";
          break;
        case wbI64GeU:
          pcVar10 = L"I64GeU";
          pcVar6 = L"i64.ge_u";
          break;
        case wbF32Eq:
          pcVar10 = L"F32Eq";
          pcVar6 = L"f32.eq";
          break;
        case wbF32Ne:
          pcVar10 = L"F32Ne";
          pcVar6 = L"f32.ne";
          break;
        case wbF32Lt:
          pcVar10 = L"F32Lt";
          pcVar6 = L"f32.lt";
          break;
        case wbF32Gt:
          pcVar10 = L"F32Gt";
          pcVar6 = L"f32.gt";
          break;
        case wbF32Le:
          pcVar10 = L"F32Le";
          pcVar6 = L"f32.le";
          break;
        case wbF32Ge:
          pcVar10 = L"F32Ge";
          pcVar6 = L"f32.ge";
          break;
        case wbF64Eq:
          pcVar10 = L"F64Eq";
          pcVar6 = L"f64.eq";
          break;
        case wbF64Ne:
          pcVar10 = L"F64Ne";
          pcVar6 = L"f64.ne";
          break;
        case wbF64Lt:
          pcVar10 = L"F64Lt";
          pcVar6 = L"f64.lt";
          break;
        case wbF64Gt:
          pcVar10 = L"F64Gt";
          pcVar6 = L"f64.gt";
          break;
        case wbF64Le:
          pcVar10 = L"F64Le";
          pcVar6 = L"f64.le";
          break;
        case wbF64Ge:
          pcVar10 = L"F64Ge";
          pcVar6 = L"f64.ge";
          break;
        case wbI32Clz:
          pcVar10 = L"I32Clz";
          pcVar6 = L"i32.clz";
          break;
        case wbI32Ctz:
          pcVar10 = L"I32Ctz";
          pcVar6 = L"i32.ctz";
          break;
        case wbI32Popcnt:
          pcVar10 = L"I32Popcnt";
          pcVar6 = L"i32.popcnt";
          break;
        case wbI32Add:
          pcVar10 = L"I32Add";
          pcVar6 = L"i32.add";
          break;
        case wbI32Sub:
          pcVar10 = L"I32Sub";
          pcVar6 = L"i32.sub";
          break;
        case wbI32Mul:
          pcVar10 = L"I32Mul";
          pcVar6 = L"i32.mul";
          break;
        case wbI32DivS:
          pcVar10 = L"I32DivS";
          pcVar6 = L"i32.div_s";
          break;
        case wbI32DivU:
          pcVar10 = L"I32DivU";
          pcVar6 = L"i32.div_u";
          break;
        case wbI32RemS:
          pcVar10 = L"I32RemS";
          pcVar6 = L"i32.rem_s";
          break;
        case wbI32RemU:
          pcVar10 = L"I32RemU";
          pcVar6 = L"i32.rem_u";
          break;
        case wbI32And:
          pcVar10 = L"I32And";
          pcVar6 = L"i32.and";
          break;
        case wbI32Or:
          pcVar10 = L"I32Or";
          pcVar6 = L"i32.or";
          break;
        case wbI32Xor:
          pcVar10 = L"I32Xor";
          pcVar6 = L"i32.xor";
          break;
        case wbI32Shl:
          pcVar10 = L"I32Shl";
          pcVar6 = L"i32.shl";
          break;
        case wbI32ShrS:
          pcVar10 = L"I32ShrS";
          pcVar6 = L"i32.shr_s";
          break;
        case wbI32ShrU:
          pcVar10 = L"I32ShrU";
          pcVar6 = L"i32.shr_u";
          break;
        case wbI32Rol:
          pcVar10 = L"I32Rol";
          pcVar6 = L"i32.rotl";
          break;
        case wbI32Ror:
          pcVar10 = L"I32Ror";
          pcVar6 = L"i32.rotr";
          break;
        case wbI64Clz:
          pcVar10 = L"I64Clz";
          pcVar6 = L"i64.clz";
          break;
        case wbI64Ctz:
          pcVar10 = L"I64Ctz";
          pcVar6 = L"i64.ctz";
          break;
        case wbI64Popcnt:
          pcVar10 = L"I64Popcnt";
          pcVar6 = L"i64.popcnt";
          break;
        case wbI64Add:
          pcVar10 = L"I64Add";
          pcVar6 = L"i64.add";
          break;
        case wbI64Sub:
          pcVar10 = L"I64Sub";
          pcVar6 = L"i64.sub";
          break;
        case wbI64Mul:
          pcVar10 = L"I64Mul";
          pcVar6 = L"i64.mul";
          break;
        case wbI64DivS:
          pcVar10 = L"I64DivS";
          pcVar6 = L"i64.div_s";
          break;
        case wbI64DivU:
          pcVar10 = L"I64DivU";
          pcVar6 = L"i64.div_u";
          break;
        case wbI64RemS:
          pcVar10 = L"I64RemS";
          pcVar6 = L"i64.rem_s";
          break;
        case wbI64RemU:
          pcVar10 = L"I64RemU";
          pcVar6 = L"i64.rem_u";
          break;
        case wbI64And:
          pcVar10 = L"I64And";
          pcVar6 = L"i64.and";
          break;
        case wbI64Or:
          pcVar10 = L"I64Or";
          pcVar6 = L"i64.or";
          break;
        case wbI64Xor:
          pcVar10 = L"I64Xor";
          pcVar6 = L"i64.xor";
          break;
        case wbI64Shl:
          pcVar10 = L"I64Shl";
          pcVar6 = L"i64.shl";
          break;
        case wbI64ShrS:
          pcVar10 = L"I64ShrS";
          pcVar6 = L"i64.shr_s";
          break;
        case wbI64ShrU:
          pcVar10 = L"I64ShrU";
          pcVar6 = L"i64.shr_u";
          break;
        case wbI64Rol:
          pcVar10 = L"I64Rol";
          pcVar6 = L"i64.rotl";
          break;
        case wbI64Ror:
          pcVar10 = L"I64Ror";
          pcVar6 = L"i64.rotr";
          break;
        case wbF32Abs:
          pcVar10 = L"F32Abs";
          pcVar6 = L"f32.abs";
          break;
        case wbF32Neg:
          pcVar10 = L"F32Neg";
          pcVar6 = L"f32.neg";
          break;
        case wbF32Ceil:
          pcVar10 = L"F32Ceil";
          pcVar6 = L"f32.ceil";
          break;
        case wbF32Floor:
          pcVar10 = L"F32Floor";
          pcVar6 = L"f32.floor";
          break;
        case wbF32Trunc:
          pcVar10 = L"F32Trunc";
          pcVar6 = L"f32.trunc";
          break;
        case wbF32NearestInt:
          pcVar10 = L"F32NearestInt";
          pcVar6 = L"f32.nearest";
          break;
        case wbF32Sqrt:
          pcVar10 = L"F32Sqrt";
          pcVar6 = L"f32.sqrt";
          break;
        case wbF32Add:
          pcVar10 = L"F32Add";
          pcVar6 = L"f32.add";
          break;
        case wbF32Sub:
          pcVar10 = L"F32Sub";
          pcVar6 = L"f32.sub";
          break;
        case wbF32Mul:
          pcVar10 = L"F32Mul";
          pcVar6 = L"f32.mul";
          break;
        case wbF32Div:
          pcVar10 = L"F32Div";
          pcVar6 = L"f32.div";
          break;
        case wbF32Min:
          pcVar10 = L"F32Min";
          pcVar6 = L"f32.min";
          break;
        case wbF32Max:
          pcVar10 = L"F32Max";
          pcVar6 = L"f32.max";
          break;
        case wbF32CopySign:
          pcVar10 = L"F32CopySign";
          pcVar6 = L"f32.copysign";
          break;
        case wbF64Abs:
          pcVar10 = L"F64Abs";
          pcVar6 = L"f64.abs";
          break;
        case wbF64Neg:
          pcVar10 = L"F64Neg";
          pcVar6 = L"f64.neg";
          break;
        case wbF64Ceil:
          pcVar10 = L"F64Ceil";
          pcVar6 = L"f64.ceil";
          break;
        case wbF64Floor:
          pcVar10 = L"F64Floor";
          pcVar6 = L"f64.floor";
          break;
        case wbF64Trunc:
          pcVar10 = L"F64Trunc";
          pcVar6 = L"f64.trunc";
          break;
        case wbF64NearestInt:
          pcVar10 = L"F64NearestInt";
          pcVar6 = L"f64.nearest";
          break;
        case wbF64Sqrt:
          pcVar10 = L"F64Sqrt";
          pcVar6 = L"f64.sqrt";
          break;
        case wbF64Add:
          pcVar10 = L"F64Add";
          pcVar6 = L"f64.add";
          break;
        case wbF64Sub:
          pcVar10 = L"F64Sub";
          pcVar6 = L"f64.sub";
          break;
        case wbF64Mul:
          pcVar10 = L"F64Mul";
          pcVar6 = L"f64.mul";
          break;
        case wbF64Div:
          pcVar10 = L"F64Div";
          pcVar6 = L"f64.div";
          break;
        case wbF64Min:
          pcVar10 = L"F64Min";
          pcVar6 = L"f64.min";
          break;
        case wbF64Max:
          pcVar10 = L"F64Max";
          pcVar6 = L"f64.max";
          break;
        case wbF64CopySign:
          pcVar10 = L"F64CopySign";
          pcVar6 = L"f64.copysign";
          break;
        case wbI32Wrap_I64:
          pcVar10 = L"I32Wrap_I64";
          pcVar6 = L"i32.wrap/i64";
          break;
        case wbI32TruncS_F32:
          pcVar10 = L"I32TruncS_F32";
          pcVar6 = L"i32.trunc_s/f32";
          break;
        case wbI32TruncU_F32:
          pcVar10 = L"I32TruncU_F32";
          pcVar6 = L"i32.trunc_u/f32";
          break;
        case wbI32TruncS_F64:
          pcVar10 = L"I32TruncS_F64";
          pcVar6 = L"i32.trunc_s/f64";
          break;
        case wbI32TruncU_F64:
          pcVar10 = L"I32TruncU_F64";
          pcVar6 = L"i32.trunc_u/f64";
          break;
        case wbI64ExtendS_I32:
          pcVar10 = L"I64ExtendS_I32";
          pcVar6 = L"i64.extend_s/i32";
          break;
        case wbI64ExtendU_I32:
          pcVar10 = L"I64ExtendU_I32";
          pcVar6 = L"i64.extend_u/i32";
          break;
        case wbI64TruncS_F32:
          pcVar10 = L"I64TruncS_F32";
          pcVar6 = L"i64.trunc_s/f32";
          break;
        case wbI64TruncU_F32:
          pcVar10 = L"I64TruncU_F32";
          pcVar6 = L"i64.trunc_u/f32";
          break;
        case wbI64TruncS_F64:
          pcVar10 = L"I64TruncS_F64";
          pcVar6 = L"i64.trunc_s/f64";
          break;
        case wbI64TruncU_F64:
          pcVar10 = L"I64TruncU_F64";
          pcVar6 = L"i64.trunc_u/f64";
          break;
        case wbF32SConvertI32:
          pcVar10 = L"F32SConvertI32";
          pcVar6 = L"f32.convert_s/i32";
          break;
        case wbF32UConvertI32:
          pcVar10 = L"F32UConvertI32";
          pcVar6 = L"f32.convert_u/i32";
          break;
        case wbF32SConvertI64:
          pcVar10 = L"F32SConvertI64";
          pcVar6 = L"f32.convert_s/i64";
          break;
        case wbF32UConvertI64:
          pcVar10 = L"F32UConvertI64";
          pcVar6 = L"f32.convert_u/i64";
          break;
        case wbF32DemoteF64:
          pcVar10 = L"F32DemoteF64";
          pcVar6 = L"f32.demote/f64";
          break;
        case wbF64SConvertI32:
          pcVar10 = L"F64SConvertI32";
          pcVar6 = L"f64.convert_s/i32";
          break;
        case wbF64UConvertI32:
          pcVar10 = L"F64UConvertI32";
          pcVar6 = L"f64.convert_u/i32";
          break;
        case wbF64SConvertI64:
          pcVar10 = L"F64SConvertI64";
          pcVar6 = L"f64.convert_s/i64";
          break;
        case wbF64UConvertI64:
          pcVar10 = L"F64UConvertI64";
          pcVar6 = L"f64.convert_u/i64";
          break;
        case wbF64PromoteF32:
          pcVar10 = L"F64PromoteF32";
          pcVar6 = L"f64.promote/f32";
          break;
        case wbI32ReinterpretF32:
          pcVar10 = L"I32ReinterpretF32";
          pcVar6 = L"i32.reinterpret/f32";
          break;
        case wbI64ReinterpretF64:
          pcVar10 = L"I64ReinterpretF64";
          pcVar6 = L"i64.reinterpret/f64";
          break;
        case wbF32ReinterpretI32:
          pcVar10 = L"F32ReinterpretI32";
          pcVar6 = L"f32.reinterpret/i32";
          break;
        case wbF64ReinterpretI64:
          pcVar10 = L"F64ReinterpretI64";
          pcVar6 = L"f64.reinterpret/i64";
          break;
        case wbI32Extend8_s:
          pcVar10 = L"I32Extend8_s";
          pcVar6 = L"i32.extend8_s";
          break;
        case wbI32Extend16_s:
          pcVar10 = L"I32Extend16_s";
          pcVar6 = L"i32.extend16_s";
          break;
        case wbI64Extend8_s:
          pcVar10 = L"I64Extend8_s";
          pcVar6 = L"i64.extend8_s";
          break;
        case wbI64Extend16_s:
          pcVar10 = L"I64Extend16_s";
          pcVar6 = L"i64.extend16_s";
          break;
        case wbI64Extend32_s:
          pcVar10 = L"I64Extend32_s";
          pcVar6 = L"i64.extend32_s";
          break;
        default:
          switch(WVar2) {
          case wbPrintFuncName:
            pcVar10 = L"PrintFuncName";
            break;
          case wbPrintArgSeparator:
            pcVar10 = L"PrintArgSeparator";
            break;
          case wbPrintBeginCall:
            pcVar10 = L"PrintBeginCall";
            break;
          case wbPrintNewLine:
            pcVar10 = L"PrintNewLine";
            break;
          case wbPrintEndCall:
            pcVar10 = L"PrintEndCall";
            break;
          case wbPrintEndCall|wbNop:
          case wbPrintEndCall|wbBlock:
          case wbPrintEndCall|wbLoop:
          case 0xf008:
          case 0xf009:
          case 0xf00a:
          case wbPrintFuncName|wbEnd:
            goto switchD_00d6487b_caseD_fd01;
          case wbPrintI32:
            pcVar10 = L"PrintI32";
            break;
          case wbPrintI64:
            pcVar10 = L"PrintI64";
            break;
          case wbPrintF32:
            pcVar10 = L"PrintF32";
            break;
          case wbPrintF64:
            pcVar10 = L"PrintF64";
            break;
          default:
            switch(WVar2) {
            case wbI32SatTruncS_F32:
              pcVar10 = L"I32SatTruncS_F32";
              pcVar6 = L"i32.trunc_s:sat/f32";
              break;
            case wbI32SatTruncU_F32:
              pcVar10 = L"I32SatTruncU_F32";
              pcVar6 = L"i32.trunc_u:sat/f32";
              break;
            case wbI32SatTruncS_F64:
              pcVar10 = L"I32SatTruncS_F64";
              pcVar6 = L"i32.trunc_s:sat/f64";
              break;
            case wbI32SatTruncU_F64:
              pcVar10 = L"I32SatTruncU_F64";
              pcVar6 = L"i32.trunc_u:sat/f64";
              break;
            case wbI64SatTruncS_F32:
              pcVar10 = L"I64SatTruncS_F32";
              pcVar6 = L"i64.trunc_s:sat/f32";
              break;
            case wbI64SatTruncU_F32:
              pcVar10 = L"I64SatTruncU_F32";
              pcVar6 = L"i64.trunc_u:sat/f32";
              break;
            case wbI64SatTruncS_F64:
              pcVar10 = L"I64SatTruncS_F64";
              pcVar6 = L"i64.trunc_s:sat/f64";
              break;
            case wbI64SatTruncU_F64:
              pcVar10 = L"I64SatTruncU_F64";
              pcVar6 = L"i64.trunc_u:sat/f64";
              break;
            default:
              goto switchD_00d6487b_caseD_fd01;
            }
            goto LAB_00d649ae;
          }
          pcVar6 = L"";
        }
      }
LAB_00d649ae:
      Output::Print(L"%s: %s\r\n",pcVar10,pcVar6);
switchD_00d6487b_caseD_fd01:
    }
    Memory::DeleteArray<Memory::HeapAllocator,Wasm::WasmOp>
              (&Memory::HeapAllocator::Instance,count,obj);
  }
  return;
}

Assistant:

void WasmBinaryReader::PrintOps()
{
    int count = m_ops->Count();
    if (count == 0)
    {
        return;
    }
    WasmOp* ops = HeapNewArray(WasmOp, count);

    auto iter = m_ops->GetIterator();
    int i = 0;
    while (iter.IsValid())
    {
        __analysis_assume(i < count);
        ops[i] = iter.CurrentKey();
        iter.MoveNext();
        ++i;
    }
    for (i = 0; i < count; ++i)
    {
        int j = i;
        while (j > 0 && ops[j-1] > ops[j])
        {
            WasmOp tmp = ops[j];
            ops[j] = ops[j - 1];
            ops[j - 1] = tmp;

            --j;
        }
    }

    uint32 moduleId = m_module->GetWasmFunctionInfo(0)->GetBody()->GetSourceContextId();
    Output::Print(_u("Module #%u's current opcode distribution\n"), moduleId);
    for (i = 0; i < count; ++i)
    {
        switch (ops[i])
        {
#define WASM_OPCODE(opname, opcode, sig, imp, wat) \
    case opcode: \
        Output::Print(_u("%s: %s\r\n"), _u(#opname), _u(wat)); \
        break;
#include "WasmBinaryOpCodes.h"
        }
    }
    HeapDeleteArray(count, ops);
}